

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O0

bool __thiscall
S2MinDistanceShapeIndexTarget::UpdateMinDistance
          (S2MinDistanceShapeIndexTarget *this,S2Point *p,S2MinDistance *min_dist)

{
  bool bVar1;
  undefined1 local_40 [8];
  PointTarget target;
  S2MinDistance *min_dist_local;
  S2Point *p_local;
  S2MinDistanceShapeIndexTarget *this_local;
  
  target.super_S2MinDistancePointTarget.point_.c_[2] = (VType)min_dist;
  S2ClosestEdgeQuery::PointTarget::PointTarget((PointTarget *)local_40,p);
  bVar1 = UpdateMinDistance(this,(S2MinDistanceTarget *)local_40,
                            (S2MinDistance *)target.super_S2MinDistancePointTarget.point_.c_[2]);
  S2ClosestEdgeQuery::PointTarget::~PointTarget((PointTarget *)local_40);
  return bVar1;
}

Assistant:

bool S2MinDistanceShapeIndexTarget::UpdateMinDistance(
    const S2Point& p, S2MinDistance* min_dist) {
  S2ClosestEdgeQuery::PointTarget target(p);
  return UpdateMinDistance(&target, min_dist);
}